

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::push
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *elem,
          Element *element)

{
  if (((elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (elem->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
       super__Vector_impl_data._M_finish) || (element->id != 0)) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>(elem,element);
  }
  return;
}

Assistant:

void push(Element& elem, typename L::Element&& element) const noexcept {
    if (elem.empty() && element == lattice.getBottom()) {
      // no-op, the stack is already entirely made of bottoms.
      return;
    }
    elem.emplace_back(std::move(element));
  }